

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

String testing::internal::FlagToEnvVar(char *flag)

{
  Message *this;
  size_t extraout_RDX;
  internal *in_RDI;
  size_t i;
  size_t sVar1;
  String SVar2;
  Message env_var;
  String full_flag;
  char local_41;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  String local_38;
  char *local_28;
  
  Message::Message((Message *)&local_40);
  this = Message::operator<<((Message *)&local_40,(char (*) [7])"gtest_");
  Message::operator<<(this,&local_28);
  Message::GetString((Message *)&local_38);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_40);
  Message::Message((Message *)&local_40);
  for (sVar1 = 0; sVar1 != local_38.length_; sVar1 = sVar1 + 1) {
    local_41 = ToUpper(local_38.c_str_[sVar1]);
    Message::operator<<((Message *)&local_40,&local_41);
  }
  StringStreamToString(in_RDI,local_40.ptr_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_40);
  String::~String(&local_38);
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = (char *)in_RDI;
  return SVar2;
}

Assistant:

static String FlagToEnvVar(const char* flag) {
  const String full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}